

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

void __thiscall
vkt::texture::anon_unknown_0::Texture3DLodControlTestInstance::Texture3DLodControlTestInstance
          (Texture3DLodControlTestInstance *this,Context *context,
          Texture3DMipmapTestCaseParameters *testParameters)

{
  deInt32 *pdVar1;
  char *pcVar2;
  Precision PVar3;
  FilterMode FVar4;
  FilterMode FVar5;
  FilterMode FVar6;
  WrapMode WVar7;
  WrapMode WVar8;
  VkFormat VVar9;
  int iVar10;
  undefined4 uVar11;
  int i;
  SharedPtrStateBase *pSVar12;
  TestTexture3D *pTVar13;
  SharedPtrStateBase *pSVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  TextureFormatInfo fmtInfo;
  float local_c8 [4];
  Vec4 local_b8;
  RGBA local_a8 [4];
  PixelBufferAccess local_98;
  TextureFormatInfo local_70;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture3DLodControlTestInstance_00d67c48;
  this->m_texWidth = 0x20;
  this->m_texHeight = 0x20;
  this->m_texDepth = 0x20;
  PVar3 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.texCoordPrecision;
  FVar4 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.minFilter;
  FVar5 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.magFilter;
  FVar6 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.magFilter;
  WVar7 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.wrapS;
  WVar8 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.wrapT;
  VVar9 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.format;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.sampleCount =
       (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
       super_TextureCommonTestCaseParameters.sampleCount;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.texCoordPrecision = PVar3;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.minFilter = FVar4;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.magFilter = FVar5;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.magFilter = FVar6;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.wrapS = WVar7;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.wrapT = WVar8;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  super_TextureCommonTestCaseParameters.format = VVar9;
  std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::vector
            (&(this->m_testParameters).super_Texture3DTestCaseParameters.
              super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.programs,
             &(testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
              super_TextureCommonTestCaseParameters.programs);
  iVar10 = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
           height;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.width
       = (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.width
  ;
  (this->m_testParameters).super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
  height = iVar10;
  iVar10 = (testParameters->super_Texture3DTestCaseParameters).depth;
  (this->m_testParameters).super_Texture3DTestCaseParameters.wrapR =
       (testParameters->super_Texture3DTestCaseParameters).wrapR;
  (this->m_testParameters).super_Texture3DTestCaseParameters.depth = iVar10;
  uVar11 = *(undefined4 *)&(testParameters->super_TextureMipmapCommonTestCaseParameters).field_0x4;
  pcVar2 = (testParameters->super_TextureMipmapCommonTestCaseParameters).minFilterName;
  (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType =
       (testParameters->super_TextureMipmapCommonTestCaseParameters).coordType;
  *(undefined4 *)&(this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.field_0x4 =
       uVar11;
  (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.minFilterName = pcVar2;
  this->m_minFilter =
       (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
       super_TextureCommonTestCaseParameters.minFilter;
  (this->m_texture).m_ptr = (TestTexture3D *)0x0;
  (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
  pSVar12 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar12->strongRefCount = 0;
  pSVar12->weakRefCount = 0;
  pSVar12->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d67210;
  pSVar12[1]._vptr_SharedPtrStateBase = (_func_int **)0x0;
  (this->m_texture).m_state = pSVar12;
  pSVar12->strongRefCount = 1;
  pSVar12->weakRefCount = 1;
  util::TextureRenderer::TextureRenderer
            (&this->m_renderer,context,
             (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,this->m_texWidth << 2,
             this->m_texHeight << 2);
  local_98.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)&local_98);
  uVar16 = this->m_texHeight;
  if (this->m_texHeight < this->m_texWidth) {
    uVar16 = this->m_texWidth;
  }
  if ((int)uVar16 <= this->m_texDepth) {
    uVar16 = this->m_texDepth;
  }
  if (uVar16 == 0) {
    uVar17 = 0x20;
  }
  else {
    uVar17 = 0x1f;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar17 == 0; uVar17 = uVar17 - 1) {
      }
    }
    uVar17 = uVar17 ^ 0x1f;
  }
  pTVar13 = (TestTexture3D *)operator_new(0x78);
  local_98.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  vkt::pipeline::TestTexture3D::TestTexture3D
            (pTVar13,(TextureFormat *)&local_98,this->m_texWidth,this->m_texHeight,this->m_texDepth)
  ;
  pSVar14 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar14->strongRefCount = 0;
  pSVar14->weakRefCount = 0;
  pSVar14->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d67210;
  pSVar14[1]._vptr_SharedPtrStateBase = (_func_int **)pTVar13;
  pSVar14->strongRefCount = 1;
  pSVar14->weakRefCount = 1;
  pSVar12 = (this->m_texture).m_state;
  if (pSVar12 != pSVar14) {
    if (pSVar12 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar12->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_texture).m_ptr = (TestTexture3D *)0x0;
        (*((this->m_texture).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_texture).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar12 = (this->m_texture).m_state;
        if (pSVar12 != (SharedPtrStateBase *)0x0) {
          (*pSVar12->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_texture).m_ptr = pTVar13;
    (this->m_texture).m_state = pSVar14;
    LOCK();
    pSVar14->strongRefCount = pSVar14->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_texture).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar1 = &pSVar14->strongRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar14->_vptr_SharedPtrStateBase[2])(pSVar14);
  }
  LOCK();
  pdVar1 = &pSVar14->weakRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar14->_vptr_SharedPtrStateBase[1])(pSVar14);
  }
  if (uVar16 != 0) {
    uVar16 = 0;
    if (0 < (int)(0x1f - uVar17)) {
      uVar16 = 0x1f - uVar17;
    }
    uVar17 = 0;
    do {
      pTVar13 = (this->m_texture).m_ptr;
      (*(pTVar13->super_TestTexture)._vptr_TestTexture[7])(&local_98,pTVar13,(ulong)uVar17,0);
      tcu::RGBA::toVec(local_a8);
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      local_c8[3] = 0.0;
      lVar15 = 0;
      do {
        local_c8[lVar15] = (float)local_a8[lVar15].m_value * local_70.lookupScale.m_data[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      local_b8.m_data[0] = 0.0;
      local_b8.m_data[1] = 0.0;
      local_b8.m_data[2] = 0.0;
      local_b8.m_data[3] = 0.0;
      lVar15 = 0;
      do {
        local_b8.m_data[lVar15] = local_c8[lVar15] + local_70.lookupBias.m_data[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      tcu::clear(&local_98,&local_b8);
      bVar18 = uVar17 != uVar16;
      uVar17 = uVar17 + 1;
    } while (bVar18);
  }
  util::TextureRenderer::add3DTexture(&this->m_renderer,&this->m_texture);
  return;
}

Assistant:

Texture3DLodControlTestInstance::Texture3DLodControlTestInstance (Context& context, const Texture3DMipmapTestCaseParameters& testParameters)
	: TestInstance		(context)
	, m_texWidth		(32)
	, m_texHeight		(32)
	, m_texDepth		(32)
	, m_testParameters	(testParameters)
	, m_minFilter		(testParameters.minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context, testParameters.sampleCount, m_texWidth*4, m_texHeight*4)
{
	const VkFormat			format		= VK_FORMAT_R8G8B8A8_UNORM;
	tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(mapVkFormat(format));
	const tcu::Vec4&		cScale		= fmtInfo.lookupScale;
	const tcu::Vec4&		cBias		= fmtInfo.lookupBias;
	const int				numLevels	= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth))+1;

	m_texture = TestTexture3DSp(new pipeline::TestTexture3D(vk::mapVkFormat(format), m_texWidth, m_texHeight, m_texDepth));

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const deUint32	step	= 0xff / (numLevels-1);
		const deUint32	inc		= deClamp32(step*levelNdx, 0x00, 0xff);
		const deUint32	dec		= 0xff - inc;
		const deUint32	rgb		= (inc << 16) | (dec << 8) | 0xff;
		const deUint32	color	= 0xff000000 | rgb;

		tcu::clear(m_texture->getLevel(levelNdx, 0), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_renderer.add3DTexture(m_texture);
}